

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::GraphemeCountOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  idx_t iVar6;
  idx_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  idx_t iVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar9 = &(ldata->value).pointer.ptr;
    iVar6 = count;
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      input.value.pointer.ptr = (char *)iVar6;
      input.value._0_8_ = *ppcVar9;
      lVar3 = GraphemeCountOperator::Operation<duckdb::string_t,long>
                        (*(GraphemeCountOperator **)(ppcVar9 + -1),input);
      result_data[iVar8] = lVar3;
      ppcVar9 = ppcVar9 + 2;
      iVar6 = extraout_RDX_00;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      uVar7 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      uVar7 = extraout_RDX_01;
    }
    uVar11 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
LAB_0185c836:
        ppcVar9 = &ldata[uVar11].value.pointer.ptr;
        for (; uVar4 = uVar11, uVar11 < uVar12; uVar11 = uVar11 + 1) {
          input_00.value.pointer.ptr = (char *)uVar7;
          input_00.value._0_8_ = *ppcVar9;
          lVar3 = GraphemeCountOperator::Operation<duckdb::string_t,long>
                            (*(GraphemeCountOperator **)(ppcVar9 + -1),input_00);
          result_data[uVar11] = lVar3;
          ppcVar9 = ppcVar9 + 2;
          uVar7 = extraout_RDX_02;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0185c836;
        uVar4 = uVar12;
        if (uVar2 != 0) {
          ppcVar9 = &ldata[uVar11].value.pointer.ptr;
          for (uVar10 = 0; uVar4 = uVar11 + uVar10, uVar11 + uVar10 < uVar12; uVar10 = uVar10 + 1) {
            if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
              input_01.value.pointer.ptr = (char *)uVar7;
              input_01.value._0_8_ = *ppcVar9;
              lVar3 = GraphemeCountOperator::Operation<duckdb::string_t,long>
                                (*(GraphemeCountOperator **)(ppcVar9 + -1),input_01);
              result_data[uVar11 + uVar10] = lVar3;
              uVar7 = extraout_RDX_03;
            }
            ppcVar9 = ppcVar9 + 2;
          }
        }
      }
      uVar11 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}